

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O2

void kmpc_poolprint(void)

{
  uint uVar1;
  kmp_info_t *th;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = __kmp_get_global_thread_id();
  th = __kmp_threads[iVar3];
  __kmp_bget_dequeue(th);
  uVar1 = *(uint *)(th->th_pad + 0x24);
  lVar2 = *(long *)(th->th_pad + 0x120);
  __kmp_printf_no_lock
            ("__kmp_printpool: T#%d total=%llu get=%lld rel=%lld pblk=%lld pget=%lld prel=%lld dget=%lld drel=%lld\n"
             ,(ulong)uVar1,*(undefined8 *)(lVar2 + 0x3c0),*(undefined8 *)(lVar2 + 0x3c8),
             *(undefined8 *)(lVar2 + 0x3d0),*(undefined8 *)(lVar2 + 0x3d8),
             *(undefined4 *)(lVar2 + 0x3e0),*(undefined4 *)(lVar2 + 1000),
             *(undefined4 *)(lVar2 + 0x3f0),*(undefined4 *)(lVar2 + 0x3f8));
  iVar3 = 0;
  for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 1) {
    lVar4 = lVar5 * 0x30 + lVar2;
    lVar6 = lVar4;
    while (lVar6 = *(long *)(lVar6 + 0x20), lVar6 != lVar4) {
      iVar3 = iVar3 + 1;
      __kmp_printf_no_lock
                ("__kmp_printpool: T#%d Free block: 0x%p size %6ld bytes.\n",(ulong)uVar1,lVar6,
                 *(undefined8 *)(lVar6 + 0x10));
    }
  }
  if (iVar3 != 0) {
    return;
  }
  __kmp_printf_no_lock("__kmp_printpool: T#%d No free blocks\n",(ulong)uVar1);
  return;
}

Assistant:

void kmpc_poolprint(void) {
  kmp_info_t *th = __kmp_get_thread();

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bfreed(th);
}